

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eset.c
# Opt level: O0

edata_t * eset_first_fit(eset_t *eset,size_t size,_Bool exact_only,uint lg_max_fit)

{
  edata_cmp_summary_t b;
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  int in_ECX;
  byte in_DL;
  ulong in_RSI;
  long in_RDI;
  edata_t *edata;
  pszind_t i;
  pszind_t pind;
  edata_cmp_summary_t ret_summ;
  edata_t *ret;
  pszind_t ind;
  pszind_t base_ind;
  pszind_t rg_inner_off;
  pszind_t lg_delta;
  pszind_t off_to_first_ps_rg;
  pszind_t x;
  edata_heap_t *in_stack_ffffffffffffff78;
  edata_t *local_80;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  edata_t *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  uint uVar6;
  uint64_t local_60;
  uintptr_t local_58;
  edata_t *local_50;
  int local_48;
  byte local_41;
  ulong local_40;
  long local_38;
  edata_t *local_30;
  uint local_28;
  int local_24;
  uint local_20;
  int local_1c;
  int local_18;
  uint local_14;
  size_t local_10;
  uint local_4;
  
  local_41 = in_DL & 1;
  local_50 = (edata_t *)0x0;
  local_48 = in_ECX;
  local_40 = in_RSI;
  local_38 = in_RDI;
  memset(&local_60,0,0x10);
  local_10 = duckdb_je_sz_psz_quantize_ceil
                       (CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (local_10 < 0x7000000000000001) {
    local_14 = lg_ceil(0x251a528);
    if (local_14 < 0xe) {
      in_stack_ffffffffffffff8c = 0;
    }
    else {
      in_stack_ffffffffffffff8c = local_14 - 0xe;
    }
    if (in_stack_ffffffffffffff8c == 0) {
      in_stack_ffffffffffffff88 = 0xc;
    }
    else {
      in_stack_ffffffffffffff88 = in_stack_ffffffffffffff8c + 0xb;
    }
    local_20 = (uint)(local_10 - 1 >> ((byte)in_stack_ffffffffffffff88 & 0x3f)) & 3;
    local_24 = in_stack_ffffffffffffff8c * 4;
    local_28 = local_24 + local_20;
    local_1c = in_stack_ffffffffffffff88;
    local_18 = in_stack_ffffffffffffff8c;
    local_4 = local_28;
  }
  else {
    local_4 = 199;
  }
  if ((local_41 & 1) == 0) {
    uVar6 = local_4;
    sVar4 = fb_ffs((fb_group_t *)CONCAT44(local_4,in_stack_ffffffffffffff98),
                   (size_t)in_stack_ffffffffffffff90,
                   CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    uVar2 = (uint)sVar4;
    while (uVar2 < 200) {
      if (local_48 == 0x40) {
        local_48 = 0x3f;
      }
      sVar4 = sz_pind2sz(0);
      if (local_40 < sVar4 >> ((byte)local_48 & 0x3f)) break;
      if ((local_50 == (edata_t *)0x0) ||
         (b.addr = local_58, b.sn = local_60,
         iVar3 = edata_cmp_summary_comp
                           (*(edata_cmp_summary_t *)(local_38 + (ulong)uVar2 * 0x20 + 0x30),b),
         iVar3 < 0)) {
        in_stack_ffffffffffffff90 = duckdb_je_edata_heap_first(in_stack_ffffffffffffff78);
        lVar5 = local_38 + 0x20 + (ulong)uVar2 * 0x20;
        local_60 = *(uint64_t *)(lVar5 + 0x10);
        local_58 = *(uintptr_t *)(lVar5 + 0x18);
        local_50 = in_stack_ffffffffffffff90;
      }
      if (uVar2 == 199) break;
      sVar4 = fb_ffs((fb_group_t *)CONCAT44(uVar6,uVar2),(size_t)in_stack_ffffffffffffff90,
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      uVar2 = (uint)sVar4;
    }
    local_30 = local_50;
  }
  else {
    _Var1 = duckdb_je_edata_heap_empty((edata_heap_t *)(local_38 + 0x20 + (ulong)local_4 * 0x20));
    if (_Var1) {
      local_80 = (edata_t *)0x0;
    }
    else {
      local_80 = duckdb_je_edata_heap_first(in_stack_ffffffffffffff78);
    }
    local_30 = local_80;
  }
  return local_30;
}

Assistant:

static edata_t *
eset_first_fit(eset_t *eset, size_t size, bool exact_only,
    unsigned lg_max_fit) {
	edata_t *ret = NULL;
	edata_cmp_summary_t ret_summ JEMALLOC_CC_SILENCE_INIT({0});

	pszind_t pind = sz_psz2ind(sz_psz_quantize_ceil(size));

	if (exact_only) {
		return edata_heap_empty(&eset->bins[pind].heap) ? NULL :
		    edata_heap_first(&eset->bins[pind].heap);
	}

	for (pszind_t i =
	    (pszind_t)fb_ffs(eset->bitmap, ESET_NPSIZES, (size_t)pind);
	    i < ESET_NPSIZES;
	    i = (pszind_t)fb_ffs(eset->bitmap, ESET_NPSIZES, (size_t)i + 1)) {
		assert(!edata_heap_empty(&eset->bins[i].heap));
		if (lg_max_fit == SC_PTR_BITS) {
			/*
			 * We'll shift by this below, and shifting out all the
			 * bits is undefined.  Decreasing is safe, since the
			 * page size is larger than 1 byte.
			 */
			lg_max_fit = SC_PTR_BITS - 1;
		}
		if ((sz_pind2sz(i) >> lg_max_fit) > size) {
			break;
		}
		if (ret == NULL || edata_cmp_summary_comp(
		    eset->bins[i].heap_min, ret_summ) < 0) {
			/*
			 * We grab the edata as early as possible, even though
			 * we might change it later.  Practically, a large
			 * portion of eset_fit calls succeed at the first valid
			 * index, so this doesn't cost much, and we get the
			 * effect of prefetching the edata as early as possible.
			 */
			edata_t *edata = edata_heap_first(&eset->bins[i].heap);
			assert(edata_size_get(edata) >= size);
			assert(ret == NULL || edata_snad_comp(edata, ret) < 0);
			assert(ret == NULL || edata_cmp_summary_comp(
			    eset->bins[i].heap_min,
			    edata_cmp_summary_get(edata)) == 0);
			ret = edata;
			ret_summ = eset->bins[i].heap_min;
		}
		if (i == SC_NPSIZES) {
			break;
		}
		assert(i < SC_NPSIZES);
	}

	return ret;
}